

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qft.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  void *this;
  string local_268 [32];
  stringstream local_248 [8];
  stringstream qasm;
  ostream local_238 [376];
  undefined1 local_c0 [24];
  QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> circuit;
  string local_78;
  allocator<char> local_41;
  string local_40;
  int local_20;
  int local_1c;
  int maxPrint;
  int nbQubits;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_1c = 2;
  local_20 = 5;
  _maxPrint = argv;
  argv_local._0_4_ = argc;
  if (1 < argc) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
    local_1c = std::__cxx11::stoi(&local_40,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  if (2 < (int)argv_local) {
    pcVar1 = _maxPrint[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,pcVar1,
               (allocator<char> *)
               ((long)&circuit.gates_.
                       super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_20 = std::__cxx11::stoi(&local_78,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&circuit.gates_.
                       super__Vector_base<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>,_std::allocator<std::unique_ptr<qclab::QObject<std::complex<double>_>,_std::default_delete<qclab::QObject<std::complex<double>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"nb qubits = ");
  this = (void *)std::ostream::operator<<(poVar2,local_1c);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::QCircuit
            ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
             (local_c0 + 0x10),local_1c);
  qft<std::complex<double>>
            ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
             (local_c0 + 0x10));
  if (local_1c <= local_20) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\nmatrix =");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::matrix
              ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)local_c0);
    qclab::printMatrix<qclab::dense::SquareMatrix<std::complex<double>>>
              ((SquareMatrix<std::complex<double>_> *)local_c0);
    qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
              ((SquareMatrix<std::complex<double>_> *)local_c0);
  }
  std::__cxx11::stringstream::stringstream(local_248);
  qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::toQASM
            ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
             (local_c0 + 0x10),local_238,0);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nqasm:\n");
  std::__cxx11::stringstream::str();
  std::operator<<(poVar2,local_268);
  std::__cxx11::string::~string(local_268);
  argv_local._4_4_ = 0;
  std::__cxx11::stringstream::~stringstream(local_248);
  qclab::QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_>::~QCircuit
            ((QCircuit<std::complex<double>,_qclab::QObject<std::complex<double>_>_> *)
             (local_c0 + 0x10));
  return argv_local._4_4_;
}

Assistant:

int main( int argc , char *argv[] ) {

  using T = std::complex< double > ;

  // defaults
  int nbQubits = 2 ;
  int maxPrint = 5 ;

  // arguments
  if ( argc > 1 ) nbQubits = std::stoi( argv[1] ) ;
  if ( argc > 2 ) maxPrint = std::stoi( argv[2] ) ;
  std::cout << "nb qubits = " << nbQubits << std::endl ;

  // quantum circuit
  qclab::QCircuit< T > circuit( nbQubits ) ;

  // qft
  qft( circuit ) ;

  // print matrix
  if ( nbQubits <= maxPrint ) {
    std::cout << "\nmatrix =" << std::endl ;
    qclab::printMatrix( circuit.matrix() ) ;
  }

  // print qasm
  std::stringstream qasm ;
  circuit.toQASM( qasm ) ;
  std::cout << "\nqasm:\n" << qasm.str() ;

  // successful
  return 0 ;

}